

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

void joypad_playback_callback(JoypadButtons *joyp,void *user_data)

{
  byte bVar1;
  Ticks ticks;
  JoypadChunk *pJVar2;
  JoypadState *pJVar3;
  ulong *puVar4;
  long *plVar5;
  JoypadStateIter JVar6;
  
  ticks = emulator_get_ticks(*user_data);
  if (ticks < **(ulong **)((long)user_data + 0x18)) {
    JVar6 = joypad_find_state(*(JoypadBuffer **)((long)user_data + 8),ticks);
    pJVar2 = JVar6.chunk;
    *(JoypadStateIter *)((long)user_data + 0x10) = JVar6;
    if (((long)JVar6.state - (long)pJVar2->data >> 4) + 1U < pJVar2->size) {
      pJVar3 = JVar6.state + 1;
    }
    else {
      pJVar2 = pJVar2->next;
      if (pJVar2->size == 0) {
        pJVar3 = (JoypadState *)0x0;
      }
      else {
        pJVar3 = pJVar2->data;
      }
    }
    *(JoypadChunk **)((long)user_data + 0x20) = pJVar2;
    *(JoypadState **)((long)user_data + 0x28) = pJVar3;
  }
  if (ticks < **(ulong **)((long)user_data + 0x18)) {
    __assert_fail("ticks >= playback->current.state->ticks",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0x10f,"void joypad_playback_callback(struct JoypadButtons *, void *)");
  }
  puVar4 = *(ulong **)((long)user_data + 0x28);
  if (puVar4 != (ulong *)0x0) {
    do {
      if (ticks < *puVar4) break;
      if (*puVar4 < **(ulong **)((long)user_data + 0x18)) {
        __assert_fail("playback->next.state->ticks >= playback->current.state->ticks",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                      ,0x112,"void joypad_playback_callback(struct JoypadButtons *, void *)");
      }
      *(undefined8 *)((long)user_data + 0x10) = *(undefined8 *)((long)user_data + 0x20);
      *(undefined8 *)((long)user_data + 0x18) = *(undefined8 *)((long)user_data + 0x28);
      plVar5 = *(long **)((long)user_data + 0x20);
      if (((long)puVar4 - *plVar5 >> 4) + 1U < (ulong)plVar5[1]) {
        puVar4 = puVar4 + 2;
      }
      else {
        plVar5 = (long *)plVar5[3];
        if (plVar5[1] == 0) {
          puVar4 = (ulong *)0x0;
        }
        else {
          puVar4 = (ulong *)*plVar5;
        }
      }
      *(long **)((long)user_data + 0x20) = plVar5;
      *(ulong **)((long)user_data + 0x28) = puVar4;
    } while (puVar4 != (ulong *)0x0);
  }
  bVar1 = *(byte *)(*(long *)((long)user_data + 0x18) + 8);
  joyp->down = (uint)(bVar1 >> 7);
  joyp->up = bVar1 >> 6 & TRUE;
  joyp->left = bVar1 >> 5 & TRUE;
  joyp->right = bVar1 >> 4 & TRUE;
  joyp->start = bVar1 >> 3 & TRUE;
  joyp->select = bVar1 >> 2 & TRUE;
  joyp->B = bVar1 >> 1 & TRUE;
  joyp->A = bVar1 & TRUE;
  return;
}

Assistant:

static void joypad_playback_callback(struct JoypadButtons* joyp,
                                     void* user_data) {
  Bool changed = FALSE;
  JoypadPlayback* playback = user_data;
  Ticks ticks = emulator_get_ticks(playback->e);
  if (ticks < playback->current.state->ticks) {
    playback->current = joypad_find_state(playback->buffer, ticks);
    playback->next = joypad_get_next_state(playback->current);
    changed = TRUE;
  }

  assert(ticks >= playback->current.state->ticks);

  while (playback->next.state && playback->next.state->ticks <= ticks) {
    assert(playback->next.state->ticks >= playback->current.state->ticks);
    playback->current = playback->next;
    playback->next = joypad_get_next_state(playback->next);
    changed = TRUE;
  }

#if DEBUG_JOYPAD_BUTTONS
  if (changed) {
    print_joypad_buttons(
        playback->current.state->ticks,
        joypad_unpack_buttons(playback->current.state->buttons));
  }
#else
  (void)changed;
#endif

  *joyp = joypad_unpack_buttons(playback->current.state->buttons);
}